

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.cpp
# Opt level: O0

mz_bool mz_zip_writer_add_from_zip_reader
                  (mz_zip_archive *pZip,mz_zip_archive *pSource_zip,mz_uint src_file_index)

{
  ushort uVar1;
  mz_zip_internal_state *pArray;
  mz_uint64 cur_file_ofs;
  ulong min_new_capacity;
  undefined8 uVar2;
  uint uVar3;
  uint ext_len;
  mz_bool mVar4;
  uint uVar5;
  int iVar6;
  size_t sVar7;
  int *piVar8;
  undefined4 *puVar9;
  long lVar10;
  bool bVar11;
  ulong local_cf8;
  size_t local_cf0;
  size_t local_ce8;
  ulong local_ce0;
  undefined1 local_cc8 [8];
  mz_zip_array new_ext_block;
  mz_uint8 *pSrc_ext;
  mz_uint64 src_uncomp_size;
  mz_uint64 src_comp_size;
  mz_uint32 src_crc32;
  mz_uint32 *pSrc_descriptor;
  mz_bool has_id;
  mz_uint64 approx_new_archive_size;
  mz_uint8 *pSrc_field_data;
  mz_uint32 field_total_size;
  mz_uint32 field_data_size;
  mz_uint32 field_id;
  mz_uint32 extra_size_remaining;
  mz_uint8 *pExtra_data;
  mz_zip_array file_data_array;
  mz_bool found_zip64_ext_data_in_ldir;
  mz_uint64 local_header_uncomp_size;
  mz_uint64 local_header_comp_size;
  mz_uint32 local_header_extra_len;
  mz_uint32 local_header_filename_size;
  mz_uint32 src_ext_len;
  mz_uint32 src_comment_len;
  mz_uint32 src_filename_len;
  mz_zip_archive_file_stat src_file_stat;
  mz_uint8 *pSrc_central_header;
  void *pBuf;
  mz_zip_internal_state *pState;
  size_t orig_central_dir_size;
  mz_uint8 new_central_header [46];
  mz_uint8 *pLocal_header;
  mz_uint32 local_header_u32 [8];
  mz_uint64 local_720;
  mz_uint64 cur_dst_file_ofs;
  mz_uint64 cur_src_file_ofs;
  mz_uint64 local_dir_header_ofs;
  mz_uint64 src_archive_bytes_remaining;
  mz_uint local_6f8;
  mz_uint src_central_dir_following_data_size;
  mz_uint num_alignment_padding_bytes;
  mz_uint bit_flags;
  mz_uint n;
  mz_uint src_file_index_local;
  mz_zip_archive *pSource_zip_local;
  mz_zip_archive *pZip_local;
  mz_uint local_4d4;
  mz_zip_archive *local_4d0;
  int *local_4c8;
  undefined4 local_4bc;
  undefined1 *local_4b8;
  undefined4 local_4ac;
  mz_uint8 **local_4a8;
  undefined4 local_49c;
  size_t local_498;
  mz_zip_internal_state *local_490;
  mz_zip_archive *local_488;
  undefined4 local_47c;
  size_t local_478;
  mz_zip_internal_state *local_470;
  mz_zip_archive *local_468;
  undefined4 local_45c;
  size_t local_458;
  mz_zip_internal_state *local_450;
  mz_zip_archive *local_448;
  undefined4 local_43c;
  size_t local_438;
  mz_zip_internal_state *local_430;
  mz_zip_archive *local_428;
  undefined4 local_41c;
  size_t local_418;
  mz_zip_internal_state *local_410;
  mz_zip_archive *local_408;
  undefined4 local_3fc;
  size_t local_3f8;
  mz_zip_internal_state *local_3f0;
  mz_zip_archive *local_3e8;
  undefined4 local_3dc;
  size_t local_3d8;
  mz_zip_array *local_3d0;
  mz_zip_archive *local_3c8;
  int local_3bc;
  undefined1 *local_3b8;
  mz_zip_archive *local_3b0;
  undefined1 *local_3a8;
  mz_zip_archive *local_3a0;
  undefined1 *local_398;
  mz_zip_archive *local_390;
  undefined1 *local_388;
  mz_zip_archive *local_380;
  undefined1 *local_378;
  mz_zip_archive *local_370;
  undefined1 *local_368;
  mz_zip_archive *local_360;
  mz_uint8 **local_358;
  mz_zip_archive *local_350;
  mz_uint8 **local_348;
  mz_zip_archive *local_340;
  mz_uint8 **local_338;
  mz_zip_archive *local_330;
  mz_uint8 **local_328;
  mz_zip_archive *local_320;
  mz_uint8 **local_318;
  mz_zip_archive *local_310;
  undefined4 local_304;
  mz_uint8 *local_300;
  undefined4 local_2f4;
  mz_uint8 *local_2f0;
  undefined4 local_2e4;
  mz_uint8 *local_2e0;
  undefined4 local_2d4;
  mz_uint8 *local_2d0;
  undefined4 local_2c4;
  int *local_2c0;
  undefined4 local_2b4;
  int *local_2b0;
  ulong local_2a8;
  int *local_2a0;
  undefined4 local_294;
  int *local_290;
  uint local_284;
  int *local_280;
  ulong local_278;
  int *local_270;
  undefined4 local_264;
  int *local_260;
  uint local_254;
  int *local_250;
  undefined2 local_242;
  mz_uint8 *local_240;
  size_t local_238;
  size_t orig_size_6;
  mz_uint *local_228;
  mz_zip_array *local_220;
  mz_zip_archive *local_218;
  uint local_210;
  undefined4 local_20c;
  ulong local_208;
  mz_zip_array *local_200;
  mz_zip_archive *local_1f8;
  int local_1ec;
  size_t local_1e8;
  size_t orig_size_5;
  void *local_1d8;
  mz_zip_internal_state *local_1d0;
  mz_zip_archive *local_1c8;
  uint local_1c0;
  undefined4 local_1bc;
  size_t local_1b8;
  mz_zip_internal_state *local_1b0;
  mz_zip_archive *local_1a8;
  int local_19c;
  size_t local_198;
  size_t orig_size_4;
  size_t *local_188;
  mz_zip_internal_state *local_180;
  mz_zip_archive *local_178;
  uint local_170;
  undefined4 local_16c;
  size_t local_168;
  mz_zip_internal_state *local_160;
  mz_zip_archive *local_158;
  int local_14c;
  size_t local_148;
  size_t orig_size_3;
  void *local_138;
  mz_zip_internal_state *local_130;
  mz_zip_archive *local_128;
  uint local_120;
  undefined4 local_11c;
  size_t local_118;
  mz_zip_internal_state *local_110;
  mz_zip_archive *local_108;
  int local_fc;
  size_t local_f8;
  size_t orig_size_2;
  void *local_e8;
  mz_zip_internal_state *local_e0;
  mz_zip_archive *local_d8;
  uint local_d0;
  undefined4 local_cc;
  size_t local_c8;
  mz_zip_internal_state *local_c0;
  mz_zip_archive *local_b8;
  int local_ac;
  size_t local_a8;
  size_t orig_size_1;
  void *local_98;
  mz_zip_internal_state *local_90;
  mz_zip_archive *local_88;
  uint local_80;
  undefined4 local_7c;
  size_t local_78;
  mz_zip_internal_state *local_70;
  mz_zip_archive *local_68;
  int local_5c;
  size_t local_58;
  size_t orig_size;
  size_t *local_48;
  mz_zip_internal_state *local_40;
  mz_zip_archive *local_38;
  uint local_30;
  undefined4 local_2c;
  size_t local_28;
  mz_zip_internal_state *local_20;
  mz_zip_archive *local_18;
  int local_c;
  
  file_data_array._28_4_ = 0;
  if ((((pZip == (mz_zip_archive *)0x0) || (pZip->m_pState == (mz_zip_internal_state *)0x0)) ||
      (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING)) || (pSource_zip->m_pRead == (mz_file_read_func)0x0)
     ) {
    if (pZip != (mz_zip_archive *)0x0) {
      pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
    }
    pZip_local._0_4_ = 0;
  }
  else {
    pArray = pZip->m_pState;
    if ((pSource_zip->m_pState->m_zip64 == 0) || (pZip->m_pState->m_zip64 != 0)) {
      if ((pSource_zip == (mz_zip_archive *)0x0) ||
         ((pSource_zip->m_pState == (mz_zip_internal_state *)0x0 ||
          (pSource_zip->m_total_files <= src_file_index)))) {
        local_4c8 = (int *)0x0;
      }
      else {
        local_4c8 = (int *)((long)(pSource_zip->m_pState->m_central_dir).m_p +
                           (ulong)*(uint *)((long)(pSource_zip->m_pState->m_central_dir_offsets).m_p
                                           + (ulong)src_file_index * 4));
      }
      src_file_stat.m_comment._504_8_ = local_4c8;
      if (local_4c8 == (int *)0x0) {
        if (pZip != (mz_zip_archive *)0x0) {
          pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
        }
        pZip_local._0_4_ = 0;
      }
      else if (*local_4c8 == 0x2014b50) {
        uVar3 = (uint)*(ushort *)(local_4c8 + 7);
        uVar1 = *(ushort *)(local_4c8 + 8);
        ext_len = (uint)*(ushort *)((long)local_4c8 + 0x1e);
        src_archive_bytes_remaining._4_4_ = uVar3 + ext_len + (uint)uVar1;
        if ((pArray->m_central_dir).m_size + (ulong)src_archive_bytes_remaining._4_4_ + 0x4e <
            0xffffffff) {
          bit_flags = src_file_index;
          _n = pSource_zip;
          pSource_zip_local = pZip;
          local_4d4 = src_file_index;
          local_4d0 = pSource_zip;
          local_6f8 = mz_zip_writer_compute_padding_needed_for_file_alignment(pZip);
          if (pArray->m_zip64 == 0) {
            if (pSource_zip_local->m_total_files == 0xffff) {
              if (pSource_zip_local != (mz_zip_archive *)0x0) {
                pSource_zip_local->m_last_error = MZ_ZIP_TOO_MANY_FILES;
              }
              return 0;
            }
          }
          else if (pSource_zip_local->m_total_files == 0xffffffff) {
            if (pSource_zip_local != (mz_zip_archive *)0x0) {
              pSource_zip_local->m_last_error = MZ_ZIP_TOO_MANY_FILES;
            }
            return 0;
          }
          mVar4 = mz_zip_file_stat_internal
                            (_n,bit_flags,(mz_uint8 *)src_file_stat.m_comment._504_8_,
                             (mz_zip_archive_file_stat *)&src_comment_len,(mz_bool *)0x0);
          uVar2 = src_file_stat._56_8_;
          if (mVar4 == 0) {
            pZip_local._0_4_ = 0;
          }
          else {
            cur_file_ofs = pSource_zip_local->m_archive_size;
            sVar7 = (*_n->m_pRead)(_n->m_pIO_opaque,src_file_stat._56_8_,&pLocal_header,0x1e);
            if (sVar7 == 0x1e) {
              if ((int)pLocal_header == 0x4034b50) {
                cur_dst_file_ofs = uVar2 + 0x1e;
                field_data_size = (mz_uint32)(ushort)local_header_u32[5];
                local_dir_header_ofs =
                     (ulong)(local_header_u32[4]._2_2_ + field_data_size) + src_file_stat._32_8_;
                if ((field_data_size != 0) &&
                   ((local_header_u32._10_4_ == -1 || (local_header_u32._14_4_ == -1)))) {
                  local_4a8 = &pExtra_data;
                  local_4ac = 1;
                  memset(local_4a8,0,0x20);
                  *(undefined4 *)(local_4a8 + 3) = local_4ac;
                  local_3d8 = (size_t)field_data_size;
                  local_3c8 = pSource_zip_local;
                  local_3d0 = (mz_zip_array *)&pExtra_data;
                  local_3dc = 0;
                  if ((file_data_array.m_size < local_3d8) &&
                     (mVar4 = mz_zip_array_ensure_capacity(pSource_zip_local,local_3d0,local_3d8,0),
                     mVar4 == 0)) {
                    local_3bc = 0;
                  }
                  else {
                    local_3d0->m_size = local_3d8;
                    local_3bc = 1;
                  }
                  if (local_3bc == 0) {
                    if (pSource_zip_local != (mz_zip_archive *)0x0) {
                      pSource_zip_local->m_last_error = MZ_ZIP_ALLOC_FAILED;
                    }
                    return 0;
                  }
                  sVar7 = (*_n->m_pRead)(_n->m_pIO_opaque,
                                         src_file_stat._56_8_ + 0x1e +
                                         (ulong)(uint)local_header_u32[4]._2_2_,pExtra_data,
                                         (ulong)field_data_size);
                  if (sVar7 != field_data_size) {
                    local_310 = pSource_zip_local;
                    local_318 = &pExtra_data;
                    (*pSource_zip_local->m_pFree)(pSource_zip_local->m_pAlloc_opaque,pExtra_data);
                    memset(local_318,0,0x20);
                    if (pSource_zip_local != (mz_zip_archive *)0x0) {
                      pSource_zip_local->m_last_error = MZ_ZIP_FILE_READ_FAILED;
                    }
                    return 0;
                  }
                  _field_id = (short *)pExtra_data;
                  do {
                    if (field_data_size < 4) {
                      local_320 = pSource_zip_local;
                      local_328 = &pExtra_data;
                      (*pSource_zip_local->m_pFree)(pSource_zip_local->m_pAlloc_opaque,pExtra_data);
                      memset(local_328,0,0x20);
                      if (pSource_zip_local != (mz_zip_archive *)0x0) {
                        pSource_zip_local->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
                      }
                      return 0;
                    }
                    uVar5 = (ushort)_field_id[1] + 4;
                    if (field_data_size < uVar5) {
                      local_330 = pSource_zip_local;
                      local_338 = &pExtra_data;
                      (*pSource_zip_local->m_pFree)(pSource_zip_local->m_pAlloc_opaque,pExtra_data);
                      memset(local_338,0,0x20);
                      if (pSource_zip_local != (mz_zip_archive *)0x0) {
                        pSource_zip_local->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
                      }
                      return 0;
                    }
                    if (*_field_id == 1) {
                      if ((ushort)_field_id[1] < 0x10) {
                        local_340 = pSource_zip_local;
                        local_348 = &pExtra_data;
                        (*pSource_zip_local->m_pFree)
                                  (pSource_zip_local->m_pAlloc_opaque,pExtra_data);
                        memset(local_348,0,0x20);
                        if (pSource_zip_local != (mz_zip_archive *)0x0) {
                          pSource_zip_local->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
                        }
                        return 0;
                      }
                      file_data_array._28_4_ = 1;
                      break;
                    }
                    _field_id = (short *)((long)_field_id + (ulong)uVar5);
                    field_data_size = field_data_size - uVar5;
                  } while (field_data_size != 0);
                  local_350 = pSource_zip_local;
                  local_358 = &pExtra_data;
                  (*pSource_zip_local->m_pFree)(pSource_zip_local->m_pAlloc_opaque,pExtra_data);
                  memset(local_358,0,0x20);
                }
                if ((pArray->m_zip64 == 0) &&
                   (0xfffffffe <
                    cur_file_ofs + local_6f8 + local_dir_header_ofs + (pArray->m_central_dir).m_size
                    + (ulong)src_archive_bytes_remaining._4_4_ + 0xb2)) {
                  if (pSource_zip_local != (mz_zip_archive *)0x0) {
                    pSource_zip_local->m_last_error = MZ_ZIP_ARCHIVE_TOO_LARGE;
                  }
                  pZip_local._0_4_ = 0;
                }
                else {
                  mVar4 = mz_zip_writer_write_zeros(pSource_zip_local,cur_file_ofs,local_6f8);
                  if (mVar4 == 0) {
                    pZip_local._0_4_ = 0;
                  }
                  else {
                    local_720 = local_6f8 + cur_file_ofs;
                    cur_src_file_ofs = local_720;
                    if ((pSource_zip_local->m_file_offset_alignment != 0) &&
                       ((local_720 & pSource_zip_local->m_file_offset_alignment - 1) != 0)) {
                      __assert_fail("(local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) == 0"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/glotzerlab[P]libgetar/miniz/miniz.cpp"
                                    ,0x1ae2,
                                    "mz_bool mz_zip_writer_add_from_zip_reader(mz_zip_archive *, mz_zip_archive *, mz_uint)"
                                   );
                    }
                    sVar7 = (*pSource_zip_local->m_pWrite)
                                      (pSource_zip_local->m_pIO_opaque,local_720,&pLocal_header,0x1e
                                      );
                    if (sVar7 == 0x1e) {
                      local_720 = local_720 + 0x1e;
                      if (local_dir_header_ofs < 0x10001) {
                        local_ce0 = local_dir_header_ofs;
                      }
                      else {
                        local_ce0 = 0x10000;
                      }
                      if (local_ce0 < 0x20) {
                        local_ce8 = 0x20;
                      }
                      else {
                        if (local_dir_header_ofs < 0x10001) {
                          local_cf0 = local_dir_header_ofs;
                        }
                        else {
                          local_cf0 = 0x10000;
                        }
                        local_ce8 = local_cf0;
                      }
                      piVar8 = (int *)(*pSource_zip_local->m_pAlloc)
                                                (pSource_zip_local->m_pAlloc_opaque,1,local_ce8);
                      if (piVar8 == (int *)0x0) {
                        if (pSource_zip_local != (mz_zip_archive *)0x0) {
                          pSource_zip_local->m_last_error = MZ_ZIP_ALLOC_FAILED;
                        }
                        pZip_local._0_4_ = 0;
                      }
                      else {
                        for (; local_dir_header_ofs != 0;
                            local_dir_header_ofs =
                                 local_dir_header_ofs - num_alignment_padding_bytes) {
                          if (local_dir_header_ofs < 0x10001) {
                            local_cf8 = local_dir_header_ofs;
                          }
                          else {
                            local_cf8 = 0x10000;
                          }
                          num_alignment_padding_bytes = (mz_uint)local_cf8;
                          sVar7 = (*_n->m_pRead)(_n->m_pIO_opaque,cur_dst_file_ofs,piVar8,
                                                 local_cf8 & 0xffffffff);
                          if (sVar7 != num_alignment_padding_bytes) {
                            (*pSource_zip_local->m_pFree)(pSource_zip_local->m_pAlloc_opaque,piVar8)
                            ;
                            if (pSource_zip_local != (mz_zip_archive *)0x0) {
                              pSource_zip_local->m_last_error = MZ_ZIP_FILE_READ_FAILED;
                            }
                            return 0;
                          }
                          cur_dst_file_ofs = num_alignment_padding_bytes + cur_dst_file_ofs;
                          sVar7 = (*pSource_zip_local->m_pWrite)
                                            (pSource_zip_local->m_pIO_opaque,local_720,piVar8,
                                             (ulong)num_alignment_padding_bytes);
                          if (sVar7 != num_alignment_padding_bytes) {
                            (*pSource_zip_local->m_pFree)(pSource_zip_local->m_pAlloc_opaque,piVar8)
                            ;
                            if (pSource_zip_local != (mz_zip_archive *)0x0) {
                              pSource_zip_local->m_last_error = MZ_ZIP_FILE_WRITE_FAILED;
                            }
                            return 0;
                          }
                          local_720 = num_alignment_padding_bytes + local_720;
                        }
                        src_central_dir_following_data_size = (mz_uint)pLocal_header._6_2_;
                        if ((pLocal_header._6_2_ & 8) != 0) {
                          if ((_n->m_pState->m_zip64 == 0) && (file_data_array._28_4_ == 0)) {
                            sVar7 = (*_n->m_pRead)(_n->m_pIO_opaque,cur_dst_file_ofs,piVar8,0x10);
                            if (sVar7 != 0x10) {
                              (*pSource_zip_local->m_pFree)
                                        (pSource_zip_local->m_pAlloc_opaque,piVar8);
                              if (pSource_zip_local != (mz_zip_archive *)0x0) {
                                pSource_zip_local->m_last_error = MZ_ZIP_FILE_READ_FAILED;
                              }
                              return 0;
                            }
                            if (pSource_zip_local->m_pState->m_zip64 == 0) {
                              iVar6 = 3;
                              if (*piVar8 == 0x8074b50) {
                                iVar6 = 4;
                              }
                              num_alignment_padding_bytes = iVar6 << 2;
                            }
                            else {
                              lVar10 = 0;
                              if (*piVar8 == 0x8074b50) {
                                lVar10 = 4;
                              }
                              puVar9 = (undefined4 *)((long)piVar8 + lVar10);
                              local_2c4 = *puVar9;
                              local_254 = puVar9[1];
                              local_278 = (ulong)local_254;
                              local_284 = puVar9[2];
                              local_2a8 = (ulong)local_284;
                              local_2b4 = 0x8074b50;
                              *(undefined1 *)piVar8 = 0x50;
                              *(undefined1 *)((long)piVar8 + 1) = 0x4b;
                              *(undefined1 *)((long)piVar8 + 2) = 7;
                              *(undefined1 *)((long)piVar8 + 3) = 8;
                              local_2c0 = piVar8 + 1;
                              *(char *)local_2c0 = (char)local_2c4;
                              *(char *)((long)piVar8 + 5) = (char)((uint)local_2c4 >> 8);
                              *(char *)((long)piVar8 + 6) = (char)((uint)local_2c4 >> 0x10);
                              *(char *)((long)piVar8 + 7) = (char)((uint)local_2c4 >> 0x18);
                              local_270 = piVar8 + 2;
                              *(char *)local_270 = (char)local_254;
                              *(char *)((long)piVar8 + 9) = (char)(local_254 >> 8);
                              *(char *)((long)piVar8 + 10) = (char)(local_254 >> 0x10);
                              *(char *)((long)piVar8 + 0xb) = (char)(local_254 >> 0x18);
                              local_260 = piVar8 + 3;
                              local_264 = 0;
                              *(undefined1 *)local_260 = 0;
                              *(undefined1 *)((long)piVar8 + 0xd) = 0;
                              *(undefined1 *)((long)piVar8 + 0xe) = 0;
                              *(undefined1 *)((long)piVar8 + 0xf) = 0;
                              local_2a0 = piVar8 + 4;
                              *(char *)local_2a0 = (char)local_284;
                              *(char *)((long)piVar8 + 0x11) = (char)(local_284 >> 8);
                              *(char *)((long)piVar8 + 0x12) = (char)(local_284 >> 0x10);
                              *(char *)((long)piVar8 + 0x13) = (char)(local_284 >> 0x18);
                              local_290 = piVar8 + 5;
                              local_294 = 0;
                              *(undefined1 *)local_290 = 0;
                              *(undefined1 *)((long)piVar8 + 0x15) = 0;
                              *(undefined1 *)((long)piVar8 + 0x16) = 0;
                              *(undefined1 *)((long)piVar8 + 0x17) = 0;
                              num_alignment_padding_bytes = 0x18;
                              local_2b0 = piVar8;
                              local_280 = local_2a0;
                              local_250 = local_270;
                            }
                          }
                          else {
                            sVar7 = (*_n->m_pRead)(_n->m_pIO_opaque,cur_dst_file_ofs,piVar8,0x18);
                            if (sVar7 != 0x18) {
                              (*pSource_zip_local->m_pFree)
                                        (pSource_zip_local->m_pAlloc_opaque,piVar8);
                              if (pSource_zip_local != (mz_zip_archive *)0x0) {
                                pSource_zip_local->m_last_error = MZ_ZIP_FILE_READ_FAILED;
                              }
                              return 0;
                            }
                            iVar6 = 5;
                            if (*piVar8 == 0x8074b50) {
                              iVar6 = 6;
                            }
                            num_alignment_padding_bytes = iVar6 << 2;
                          }
                          sVar7 = (*pSource_zip_local->m_pWrite)
                                            (pSource_zip_local->m_pIO_opaque,local_720,piVar8,
                                             (ulong)num_alignment_padding_bytes);
                          if (sVar7 != num_alignment_padding_bytes) {
                            (*pSource_zip_local->m_pFree)(pSource_zip_local->m_pAlloc_opaque,piVar8)
                            ;
                            if (pSource_zip_local != (mz_zip_archive *)0x0) {
                              pSource_zip_local->m_last_error = MZ_ZIP_FILE_WRITE_FAILED;
                            }
                            return 0;
                          }
                          local_720 = num_alignment_padding_bytes + local_720;
                        }
                        (*pSource_zip_local->m_pFree)(pSource_zip_local->m_pAlloc_opaque,piVar8);
                        min_new_capacity = (pArray->m_central_dir).m_size;
                        memcpy(&orig_central_dir_size,(void *)src_file_stat.m_comment._504_8_,0x2e);
                        if (pArray->m_zip64 == 0) {
                          if (0xffffffff < local_720) {
                            if (pSource_zip_local != (mz_zip_archive *)0x0) {
                              pSource_zip_local->m_last_error = MZ_ZIP_ARCHIVE_TOO_LARGE;
                            }
                            return 0;
                          }
                          if (0xfffffffe < cur_src_file_ofs) {
                            if (pSource_zip_local != (mz_zip_archive *)0x0) {
                              pSource_zip_local->m_last_error = MZ_ZIP_ARCHIVE_TOO_LARGE;
                            }
                            return 0;
                          }
                          local_300 = new_central_header + 0x22;
                          local_304 = (undefined4)cur_src_file_ofs;
                          new_central_header[0x22] = (mz_uint8)cur_src_file_ofs;
                          new_central_header[0x23] = (mz_uint8)(cur_src_file_ofs >> 8);
                          new_central_header[0x24] = (mz_uint8)(cur_src_file_ofs >> 0x10);
                          new_central_header[0x25] = (mz_uint8)(cur_src_file_ofs >> 0x18);
                          local_188 = &orig_central_dir_size;
                          local_178 = pSource_zip_local;
                          orig_size_4 = 0x2e;
                          local_198 = (pArray->m_central_dir).m_size;
                          local_168 = local_198 + 0x2e;
                          local_158 = pSource_zip_local;
                          local_16c = 1;
                          local_180 = pArray;
                          local_160 = pArray;
                          if (((pArray->m_central_dir).m_capacity < local_168) &&
                             (mVar4 = mz_zip_array_ensure_capacity
                                                (pSource_zip_local,&pArray->m_central_dir,local_168,
                                                 1), mVar4 == 0)) {
                            local_14c = 0;
                          }
                          else {
                            (local_160->m_central_dir).m_size = local_168;
                            local_14c = 1;
                          }
                          bVar11 = local_14c != 0;
                          if (bVar11) {
                            memcpy((void *)((long)(local_180->m_central_dir).m_p +
                                           local_198 * (local_180->m_central_dir).m_element_size),
                                   local_188,orig_size_4 * (local_180->m_central_dir).m_element_size
                                  );
                          }
                          local_170 = (uint)bVar11;
                          if (local_170 == 0) {
                            if (pSource_zip_local != (mz_zip_archive *)0x0) {
                              pSource_zip_local->m_last_error = MZ_ZIP_ALLOC_FAILED;
                            }
                            return 0;
                          }
                          local_1d8 = (void *)(src_file_stat.m_comment._504_8_ + 0x2e);
                          orig_size_5 = (size_t)src_archive_bytes_remaining._4_4_;
                          local_1c8 = pSource_zip_local;
                          local_1e8 = (pArray->m_central_dir).m_size;
                          local_1b8 = local_1e8 + orig_size_5;
                          local_1a8 = pSource_zip_local;
                          local_1bc = 1;
                          local_1d0 = pArray;
                          local_1b0 = pArray;
                          if (((pArray->m_central_dir).m_capacity < local_1b8) &&
                             (mVar4 = mz_zip_array_ensure_capacity
                                                (pSource_zip_local,&pArray->m_central_dir,local_1b8,
                                                 1), mVar4 == 0)) {
                            local_19c = 0;
                          }
                          else {
                            (local_1b0->m_central_dir).m_size = local_1b8;
                            local_19c = 1;
                          }
                          bVar11 = local_19c != 0;
                          if (bVar11) {
                            memcpy((void *)((long)(local_1d0->m_central_dir).m_p +
                                           local_1e8 * (local_1d0->m_central_dir).m_element_size),
                                   local_1d8,orig_size_5 * (local_1d0->m_central_dir).m_element_size
                                  );
                          }
                          local_1c0 = (uint)bVar11;
                          if (local_1c0 == 0) {
                            local_448 = pSource_zip_local;
                            local_45c = 0;
                            local_458 = min_new_capacity;
                            local_450 = pArray;
                            if ((min_new_capacity <= (pArray->m_central_dir).m_capacity) ||
                               (mVar4 = mz_zip_array_ensure_capacity
                                                  (pSource_zip_local,&pArray->m_central_dir,
                                                   min_new_capacity,0), mVar4 != 0)) {
                              (local_450->m_central_dir).m_size = local_458;
                            }
                            if (pSource_zip_local != (mz_zip_archive *)0x0) {
                              pSource_zip_local->m_last_error = MZ_ZIP_ALLOC_FAILED;
                            }
                            return 0;
                          }
                        }
                        else {
                          new_ext_block._24_8_ =
                               src_file_stat.m_comment._504_8_ + 0x2e + (ulong)uVar3;
                          local_4b8 = local_cc8;
                          local_4bc = 1;
                          memset(local_4b8,0,0x20);
                          *(undefined4 *)(local_4b8 + 0x18) = local_4bc;
                          local_2d0 = new_central_header + 0xc;
                          local_2d4 = 0xffffffff;
                          new_central_header[0xc] = 0xff;
                          new_central_header[0xd] = 0xff;
                          new_central_header[0xe] = 0xff;
                          new_central_header[0xf] = 0xff;
                          local_2e0 = new_central_header + 0x10;
                          local_2e4 = 0xffffffff;
                          new_central_header[0x10] = 0xff;
                          new_central_header[0x11] = 0xff;
                          new_central_header[0x12] = 0xff;
                          new_central_header[0x13] = 0xff;
                          local_2f0 = new_central_header + 0x22;
                          local_2f4 = 0xffffffff;
                          new_central_header[0x22] = 0xff;
                          new_central_header[0x23] = 0xff;
                          new_central_header[0x24] = 0xff;
                          new_central_header[0x25] = 0xff;
                          mVar4 = mz_zip_writer_update_zip64_extension_block
                                            ((mz_zip_array *)local_cc8,pSource_zip_local,
                                             (mz_uint8 *)new_ext_block._24_8_,ext_len,
                                             (mz_uint64 *)&src_file_stat.m_crc32,
                                             &src_file_stat.m_comp_size,&cur_src_file_ofs,
                                             (mz_uint32 *)0x0);
                          if (mVar4 == 0) {
                            local_360 = pSource_zip_local;
                            local_368 = local_cc8;
                            (*pSource_zip_local->m_pFree)
                                      (pSource_zip_local->m_pAlloc_opaque,(void *)local_cc8);
                            memset(local_368,0,0x20);
                            return 0;
                          }
                          local_240 = new_central_header + 0x16;
                          local_242 = SUB82(new_ext_block.m_p,0);
                          new_central_header[0x16] = (mz_uint8)new_ext_block.m_p;
                          new_central_header[0x17] = (mz_uint8)((ulong)new_ext_block.m_p >> 8);
                          local_48 = &orig_central_dir_size;
                          local_38 = pSource_zip_local;
                          orig_size = 0x2e;
                          local_58 = (pArray->m_central_dir).m_size;
                          local_28 = local_58 + 0x2e;
                          local_18 = pSource_zip_local;
                          local_2c = 1;
                          local_40 = pArray;
                          local_20 = pArray;
                          if (((pArray->m_central_dir).m_capacity < local_28) &&
                             (mVar4 = mz_zip_array_ensure_capacity
                                                (pSource_zip_local,&pArray->m_central_dir,local_28,1
                                                ), mVar4 == 0)) {
                            local_c = 0;
                          }
                          else {
                            (local_20->m_central_dir).m_size = local_28;
                            local_c = 1;
                          }
                          bVar11 = local_c != 0;
                          if (bVar11) {
                            memcpy((void *)((long)(local_40->m_central_dir).m_p +
                                           local_58 * (local_40->m_central_dir).m_element_size),
                                   local_48,orig_size * (local_40->m_central_dir).m_element_size);
                          }
                          local_30 = (uint)bVar11;
                          if (local_30 == 0) {
                            local_370 = pSource_zip_local;
                            local_378 = local_cc8;
                            (*pSource_zip_local->m_pFree)
                                      (pSource_zip_local->m_pAlloc_opaque,(void *)local_cc8);
                            memset(local_378,0,0x20);
                            if (pSource_zip_local != (mz_zip_archive *)0x0) {
                              pSource_zip_local->m_last_error = MZ_ZIP_ALLOC_FAILED;
                            }
                            return 0;
                          }
                          local_98 = (void *)(src_file_stat.m_comment._504_8_ + 0x2e);
                          orig_size_1 = (size_t)uVar3;
                          local_88 = pSource_zip_local;
                          local_a8 = (pArray->m_central_dir).m_size;
                          local_78 = local_a8 + orig_size_1;
                          local_68 = pSource_zip_local;
                          local_7c = 1;
                          local_90 = pArray;
                          local_70 = pArray;
                          if (((pArray->m_central_dir).m_capacity < local_78) &&
                             (mVar4 = mz_zip_array_ensure_capacity
                                                (pSource_zip_local,&pArray->m_central_dir,local_78,1
                                                ), mVar4 == 0)) {
                            local_5c = 0;
                          }
                          else {
                            (local_70->m_central_dir).m_size = local_78;
                            local_5c = 1;
                          }
                          bVar11 = local_5c != 0;
                          if (bVar11) {
                            memcpy((void *)((long)(local_90->m_central_dir).m_p +
                                           local_a8 * (local_90->m_central_dir).m_element_size),
                                   local_98,orig_size_1 * (local_90->m_central_dir).m_element_size);
                          }
                          local_80 = (uint)bVar11;
                          if (local_80 == 0) {
                            local_380 = pSource_zip_local;
                            local_388 = local_cc8;
                            (*pSource_zip_local->m_pFree)
                                      (pSource_zip_local->m_pAlloc_opaque,(void *)local_cc8);
                            memset(local_388,0,0x20);
                            local_3e8 = pSource_zip_local;
                            local_3fc = 0;
                            local_3f8 = min_new_capacity;
                            local_3f0 = pArray;
                            if ((min_new_capacity <= (pArray->m_central_dir).m_capacity) ||
                               (mVar4 = mz_zip_array_ensure_capacity
                                                  (pSource_zip_local,&pArray->m_central_dir,
                                                   min_new_capacity,0), mVar4 != 0)) {
                              (local_3f0->m_central_dir).m_size = local_3f8;
                            }
                            if (pSource_zip_local != (mz_zip_archive *)0x0) {
                              pSource_zip_local->m_last_error = MZ_ZIP_ALLOC_FAILED;
                            }
                            return 0;
                          }
                          local_d8 = pSource_zip_local;
                          local_e8 = (void *)local_cc8;
                          orig_size_2 = (size_t)new_ext_block.m_p;
                          local_f8 = (pArray->m_central_dir).m_size;
                          local_c8 = local_f8 + (long)new_ext_block.m_p;
                          local_b8 = pSource_zip_local;
                          local_cc = 1;
                          local_e0 = pArray;
                          local_c0 = pArray;
                          if (((pArray->m_central_dir).m_capacity < local_c8) &&
                             (mVar4 = mz_zip_array_ensure_capacity
                                                (pSource_zip_local,&pArray->m_central_dir,local_c8,1
                                                ), mVar4 == 0)) {
                            local_ac = 0;
                          }
                          else {
                            (local_c0->m_central_dir).m_size = local_c8;
                            local_ac = 1;
                          }
                          bVar11 = local_ac != 0;
                          if (bVar11) {
                            memcpy((void *)((long)(local_e0->m_central_dir).m_p +
                                           local_f8 * (local_e0->m_central_dir).m_element_size),
                                   local_e8,orig_size_2 * (local_e0->m_central_dir).m_element_size);
                          }
                          local_d0 = (uint)bVar11;
                          if (local_d0 == 0) {
                            local_390 = pSource_zip_local;
                            local_398 = local_cc8;
                            (*pSource_zip_local->m_pFree)
                                      (pSource_zip_local->m_pAlloc_opaque,(void *)local_cc8);
                            memset(local_398,0,0x20);
                            local_408 = pSource_zip_local;
                            local_41c = 0;
                            local_418 = min_new_capacity;
                            local_410 = pArray;
                            if ((min_new_capacity <= (pArray->m_central_dir).m_capacity) ||
                               (mVar4 = mz_zip_array_ensure_capacity
                                                  (pSource_zip_local,&pArray->m_central_dir,
                                                   min_new_capacity,0), mVar4 != 0)) {
                              (local_410->m_central_dir).m_size = local_418;
                            }
                            if (pSource_zip_local != (mz_zip_archive *)0x0) {
                              pSource_zip_local->m_last_error = MZ_ZIP_ALLOC_FAILED;
                            }
                            return 0;
                          }
                          local_138 = (void *)(src_file_stat.m_comment._504_8_ + 0x2e + (ulong)uVar3
                                              + (ulong)ext_len);
                          orig_size_3 = (size_t)(uint)uVar1;
                          local_128 = pSource_zip_local;
                          local_148 = (pArray->m_central_dir).m_size;
                          local_118 = local_148 + orig_size_3;
                          local_108 = pSource_zip_local;
                          local_11c = 1;
                          local_130 = pArray;
                          local_110 = pArray;
                          if (((pArray->m_central_dir).m_capacity < local_118) &&
                             (mVar4 = mz_zip_array_ensure_capacity
                                                (pSource_zip_local,&pArray->m_central_dir,local_118,
                                                 1), mVar4 == 0)) {
                            local_fc = 0;
                          }
                          else {
                            (local_110->m_central_dir).m_size = local_118;
                            local_fc = 1;
                          }
                          bVar11 = local_fc != 0;
                          if (bVar11) {
                            memcpy((void *)((long)(local_130->m_central_dir).m_p +
                                           local_148 * (local_130->m_central_dir).m_element_size),
                                   local_138,orig_size_3 * (local_130->m_central_dir).m_element_size
                                  );
                          }
                          local_120 = (uint)bVar11;
                          if (local_120 == 0) {
                            local_3a0 = pSource_zip_local;
                            local_3a8 = local_cc8;
                            (*pSource_zip_local->m_pFree)
                                      (pSource_zip_local->m_pAlloc_opaque,(void *)local_cc8);
                            memset(local_3a8,0,0x20);
                            local_428 = pSource_zip_local;
                            local_43c = 0;
                            local_438 = min_new_capacity;
                            local_430 = pArray;
                            if ((min_new_capacity <= (pArray->m_central_dir).m_capacity) ||
                               (mVar4 = mz_zip_array_ensure_capacity
                                                  (pSource_zip_local,&pArray->m_central_dir,
                                                   min_new_capacity,0), mVar4 != 0)) {
                              (local_430->m_central_dir).m_size = local_438;
                            }
                            if (pSource_zip_local != (mz_zip_archive *)0x0) {
                              pSource_zip_local->m_last_error = MZ_ZIP_ALLOC_FAILED;
                            }
                            return 0;
                          }
                          local_3b0 = pSource_zip_local;
                          local_3b8 = local_cc8;
                          (*pSource_zip_local->m_pFree)
                                    (pSource_zip_local->m_pAlloc_opaque,(void *)local_cc8);
                          memset(local_3b8,0,0x20);
                        }
                        if ((pArray->m_central_dir).m_size < 0xffffffff) {
                          num_alignment_padding_bytes = (mz_uint)min_new_capacity;
                          local_220 = &pArray->m_central_dir_offsets;
                          local_218 = pSource_zip_local;
                          local_228 = &num_alignment_padding_bytes;
                          orig_size_6 = 1;
                          local_238 = (pArray->m_central_dir_offsets).m_size;
                          local_208 = local_238 + 1;
                          local_1f8 = pSource_zip_local;
                          local_20c = 1;
                          local_200 = local_220;
                          if (((pArray->m_central_dir_offsets).m_capacity < local_208) &&
                             (mVar4 = mz_zip_array_ensure_capacity
                                                (pSource_zip_local,local_220,local_208,1),
                             mVar4 == 0)) {
                            local_1ec = 0;
                          }
                          else {
                            local_200->m_size = local_208;
                            local_1ec = 1;
                          }
                          bVar11 = local_1ec != 0;
                          if (bVar11) {
                            memcpy((void *)((long)local_220->m_p +
                                           local_238 * local_220->m_element_size),local_228,
                                   orig_size_6 * local_220->m_element_size);
                          }
                          local_210 = (uint)bVar11;
                          if (local_210 == 0) {
                            local_488 = pSource_zip_local;
                            local_49c = 0;
                            local_498 = min_new_capacity;
                            local_490 = pArray;
                            if ((min_new_capacity <= (pArray->m_central_dir).m_capacity) ||
                               (mVar4 = mz_zip_array_ensure_capacity
                                                  (pSource_zip_local,&pArray->m_central_dir,
                                                   min_new_capacity,0), mVar4 != 0)) {
                              (local_490->m_central_dir).m_size = local_498;
                            }
                            if (pSource_zip_local != (mz_zip_archive *)0x0) {
                              pSource_zip_local->m_last_error = MZ_ZIP_ALLOC_FAILED;
                            }
                            pZip_local._0_4_ = 0;
                          }
                          else {
                            pSource_zip_local->m_total_files = pSource_zip_local->m_total_files + 1;
                            pSource_zip_local->m_archive_size = local_720;
                            pZip_local._0_4_ = 1;
                          }
                        }
                        else {
                          local_468 = pSource_zip_local;
                          local_47c = 0;
                          local_478 = min_new_capacity;
                          local_470 = pArray;
                          if ((min_new_capacity <= (pArray->m_central_dir).m_capacity) ||
                             (mVar4 = mz_zip_array_ensure_capacity
                                                (pSource_zip_local,&pArray->m_central_dir,
                                                 min_new_capacity,0), mVar4 != 0)) {
                            (local_470->m_central_dir).m_size = local_478;
                          }
                          if (pSource_zip_local != (mz_zip_archive *)0x0) {
                            pSource_zip_local->m_last_error = MZ_ZIP_UNSUPPORTED_CDIR_SIZE;
                          }
                          pZip_local._0_4_ = 0;
                        }
                      }
                    }
                    else {
                      if (pSource_zip_local != (mz_zip_archive *)0x0) {
                        pSource_zip_local->m_last_error = MZ_ZIP_FILE_WRITE_FAILED;
                      }
                      pZip_local._0_4_ = 0;
                    }
                  }
                }
              }
              else {
                if (pSource_zip_local != (mz_zip_archive *)0x0) {
                  pSource_zip_local->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
                }
                pZip_local._0_4_ = 0;
              }
            }
            else {
              if (pSource_zip_local != (mz_zip_archive *)0x0) {
                pSource_zip_local->m_last_error = MZ_ZIP_FILE_READ_FAILED;
              }
              pZip_local._0_4_ = 0;
            }
          }
        }
        else {
          if (pZip != (mz_zip_archive *)0x0) {
            pZip->m_last_error = MZ_ZIP_UNSUPPORTED_CDIR_SIZE;
          }
          pZip_local._0_4_ = 0;
        }
      }
      else {
        if (pZip != (mz_zip_archive *)0x0) {
          pZip->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
        }
        pZip_local._0_4_ = 0;
      }
    }
    else {
      if (pZip != (mz_zip_archive *)0x0) {
        pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
      }
      pZip_local._0_4_ = 0;
    }
  }
  return (mz_bool)pZip_local;
}

Assistant:

mz_bool mz_zip_writer_add_from_zip_reader(mz_zip_archive *pZip, mz_zip_archive *pSource_zip, mz_uint src_file_index)
{
    mz_uint n, bit_flags, num_alignment_padding_bytes, src_central_dir_following_data_size;
    mz_uint64 src_archive_bytes_remaining, local_dir_header_ofs;
    mz_uint64 cur_src_file_ofs, cur_dst_file_ofs;
    mz_uint32 local_header_u32[(MZ_ZIP_LOCAL_DIR_HEADER_SIZE + sizeof(mz_uint32) - 1) / sizeof(mz_uint32)];
    mz_uint8 *pLocal_header = (mz_uint8 *)local_header_u32;
    mz_uint8 new_central_header[MZ_ZIP_CENTRAL_DIR_HEADER_SIZE];
    size_t orig_central_dir_size;
    mz_zip_internal_state *pState;
    void *pBuf;
    const mz_uint8 *pSrc_central_header;
    mz_zip_archive_file_stat src_file_stat;
    mz_uint32 src_filename_len, src_comment_len, src_ext_len;
    mz_uint32 local_header_filename_size, local_header_extra_len;
    mz_uint64 local_header_comp_size, local_header_uncomp_size;
    mz_bool found_zip64_ext_data_in_ldir = MZ_FALSE;

    /* Sanity checks */
    if ((!pZip) || (!pZip->m_pState) || (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING) || (!pSource_zip->m_pRead))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    pState = pZip->m_pState;

    /* Don't support copying files from zip64 archives to non-zip64, even though in some cases this is possible */
    if ((pSource_zip->m_pState->m_zip64) && (!pZip->m_pState->m_zip64))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    /* Get pointer to the source central dir header and crack it */
    if (NULL == (pSrc_central_header = mz_zip_get_cdh(pSource_zip, src_file_index)))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    if (MZ_READ_LE32(pSrc_central_header + MZ_ZIP_CDH_SIG_OFS) != MZ_ZIP_CENTRAL_DIR_HEADER_SIG)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    src_filename_len = MZ_READ_LE16(pSrc_central_header + MZ_ZIP_CDH_FILENAME_LEN_OFS);
    src_comment_len = MZ_READ_LE16(pSrc_central_header + MZ_ZIP_CDH_COMMENT_LEN_OFS);
    src_ext_len = MZ_READ_LE16(pSrc_central_header + MZ_ZIP_CDH_EXTRA_LEN_OFS);
    src_central_dir_following_data_size = src_filename_len + src_ext_len + src_comment_len;

    /* TODO: We don't support central dir's >= MZ_UINT32_MAX bytes right now (+32 fudge factor in case we need to add more extra data) */
    if ((pState->m_central_dir.m_size + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + src_central_dir_following_data_size + 32) >= MZ_UINT32_MAX)
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_CDIR_SIZE);

    num_alignment_padding_bytes = mz_zip_writer_compute_padding_needed_for_file_alignment(pZip);

    if (!pState->m_zip64)
    {
        if (pZip->m_total_files == MZ_UINT16_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);
    }
    else
    {
        /* TODO: Our zip64 support still has some 32-bit limits that may not be worth fixing. */
        if (pZip->m_total_files == MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);
    }

    if (!mz_zip_file_stat_internal(pSource_zip, src_file_index, pSrc_central_header, &src_file_stat, NULL))
        return MZ_FALSE;

    cur_src_file_ofs = src_file_stat.m_local_header_ofs;
    cur_dst_file_ofs = pZip->m_archive_size;

    /* Read the source archive's local dir header */
    if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque, cur_src_file_ofs, pLocal_header, MZ_ZIP_LOCAL_DIR_HEADER_SIZE) != MZ_ZIP_LOCAL_DIR_HEADER_SIZE)
        return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);

    if (MZ_READ_LE32(pLocal_header) != MZ_ZIP_LOCAL_DIR_HEADER_SIG)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    cur_src_file_ofs += MZ_ZIP_LOCAL_DIR_HEADER_SIZE;

    /* Compute the total size we need to copy (filename+extra data+compressed data) */
    local_header_filename_size = MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_FILENAME_LEN_OFS);
    local_header_extra_len = MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_EXTRA_LEN_OFS);
    local_header_comp_size = MZ_READ_LE32(pLocal_header + MZ_ZIP_LDH_COMPRESSED_SIZE_OFS);
    local_header_uncomp_size = MZ_READ_LE32(pLocal_header + MZ_ZIP_LDH_DECOMPRESSED_SIZE_OFS);
    src_archive_bytes_remaining = local_header_filename_size + local_header_extra_len + src_file_stat.m_comp_size;

    /* Try to find a zip64 extended information field */
    if ((local_header_extra_len) && ((local_header_comp_size == MZ_UINT32_MAX) || (local_header_uncomp_size == MZ_UINT32_MAX)))
    {
        mz_zip_array file_data_array;
        const mz_uint8 *pExtra_data;
        mz_uint32 extra_size_remaining = local_header_extra_len;

        mz_zip_array_init(&file_data_array, 1);
        if (!mz_zip_array_resize(pZip, &file_data_array, local_header_extra_len, MZ_FALSE))
        {
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }

        if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque, src_file_stat.m_local_header_ofs + MZ_ZIP_LOCAL_DIR_HEADER_SIZE + local_header_filename_size, file_data_array.m_p, local_header_extra_len) != local_header_extra_len)
        {
            mz_zip_array_clear(pZip, &file_data_array);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
        }

        pExtra_data = (const mz_uint8 *)file_data_array.m_p;

        do
        {
            mz_uint32 field_id, field_data_size, field_total_size;

            if (extra_size_remaining < (sizeof(mz_uint16) * 2))
            {
                mz_zip_array_clear(pZip, &file_data_array);
                return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
            }

            field_id = MZ_READ_LE16(pExtra_data);
            field_data_size = MZ_READ_LE16(pExtra_data + sizeof(mz_uint16));
            field_total_size = field_data_size + sizeof(mz_uint16) * 2;

            if (field_total_size > extra_size_remaining)
            {
                mz_zip_array_clear(pZip, &file_data_array);
                return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
            }

            if (field_id == MZ_ZIP64_EXTENDED_INFORMATION_FIELD_HEADER_ID)
            {
                const mz_uint8 *pSrc_field_data = pExtra_data + sizeof(mz_uint32);

                if (field_data_size < sizeof(mz_uint64) * 2)
                {
                    mz_zip_array_clear(pZip, &file_data_array);
                    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
                }

                local_header_uncomp_size = MZ_READ_LE64(pSrc_field_data);
                local_header_comp_size = MZ_READ_LE64(pSrc_field_data + sizeof(mz_uint64)); /* may be 0 if there's a descriptor */

                found_zip64_ext_data_in_ldir = MZ_TRUE;
                break;
            }

            pExtra_data += field_total_size;
            extra_size_remaining -= field_total_size;
        } while (extra_size_remaining);

        mz_zip_array_clear(pZip, &file_data_array);
    }

    if (!pState->m_zip64)
    {
        /* Try to detect if the new archive will most likely wind up too big and bail early (+(sizeof(mz_uint32) * 4) is for the optional descriptor which could be present, +64 is a fudge factor). */
        /* We also check when the archive is finalized so this doesn't need to be perfect. */
        mz_uint64 approx_new_archive_size = cur_dst_file_ofs + num_alignment_padding_bytes + MZ_ZIP_LOCAL_DIR_HEADER_SIZE + src_archive_bytes_remaining + (sizeof(mz_uint32) * 4) +
                                            pState->m_central_dir.m_size + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + src_central_dir_following_data_size + MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE + 64;

        if (approx_new_archive_size >= MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);
    }

    /* Write dest archive padding */
    if (!mz_zip_writer_write_zeros(pZip, cur_dst_file_ofs, num_alignment_padding_bytes))
        return MZ_FALSE;

    cur_dst_file_ofs += num_alignment_padding_bytes;

    local_dir_header_ofs = cur_dst_file_ofs;
    if (pZip->m_file_offset_alignment)
    {
        MZ_ASSERT((local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) == 0);
    }

    /* The original zip's local header+ext block doesn't change, even with zip64, so we can just copy it over to the dest zip */
    if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_dst_file_ofs, pLocal_header, MZ_ZIP_LOCAL_DIR_HEADER_SIZE) != MZ_ZIP_LOCAL_DIR_HEADER_SIZE)
        return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

    cur_dst_file_ofs += MZ_ZIP_LOCAL_DIR_HEADER_SIZE;

    /* Copy over the source archive bytes to the dest archive, also ensure we have enough buf space to handle optional data descriptor */
    if (NULL == (pBuf = pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1, (size_t)MZ_MAX(32U, MZ_MIN((mz_uint64)MZ_ZIP_MAX_IO_BUF_SIZE, src_archive_bytes_remaining)))))
        return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);

    while (src_archive_bytes_remaining)
    {
        n = (mz_uint)MZ_MIN((mz_uint64)MZ_ZIP_MAX_IO_BUF_SIZE, src_archive_bytes_remaining);
        if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque, cur_src_file_ofs, pBuf, n) != n)
        {
            pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
        }
        cur_src_file_ofs += n;

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_dst_file_ofs, pBuf, n) != n)
        {
            pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
        }
        cur_dst_file_ofs += n;

        src_archive_bytes_remaining -= n;
    }

    /* Now deal with the optional data descriptor */
    bit_flags = MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_BIT_FLAG_OFS);
    if (bit_flags & 8)
    {
        /* Copy data descriptor */
        if ((pSource_zip->m_pState->m_zip64) || (found_zip64_ext_data_in_ldir))
        {
            /* src is zip64, dest must be zip64 */

            /* name			uint32_t's */
            /* id				1 (optional in zip64?) */
            /* crc			1 */
            /* comp_size	2 */
            /* uncomp_size 2 */
            if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque, cur_src_file_ofs, pBuf, (sizeof(mz_uint32) * 6)) != (sizeof(mz_uint32) * 6))
            {
                pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
                return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
            }

            n = sizeof(mz_uint32) * ((MZ_READ_LE32(pBuf) == MZ_ZIP_DATA_DESCRIPTOR_ID) ? 6 : 5);
        }
        else
        {
            /* src is NOT zip64 */
            mz_bool has_id;

            if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque, cur_src_file_ofs, pBuf, sizeof(mz_uint32) * 4) != sizeof(mz_uint32) * 4)
            {
                pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
                return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
            }

            has_id = (MZ_READ_LE32(pBuf) == MZ_ZIP_DATA_DESCRIPTOR_ID);

            if (pZip->m_pState->m_zip64)
            {
                /* dest is zip64, so upgrade the data descriptor */
                const mz_uint32 *pSrc_descriptor = (const mz_uint32 *)((const mz_uint8 *)pBuf + (has_id ? sizeof(mz_uint32) : 0));
                const mz_uint32 src_crc32 = pSrc_descriptor[0];
                const mz_uint64 src_comp_size = pSrc_descriptor[1];
                const mz_uint64 src_uncomp_size = pSrc_descriptor[2];

                mz_write_le32((mz_uint8 *)pBuf, MZ_ZIP_DATA_DESCRIPTOR_ID);
                mz_write_le32((mz_uint8 *)pBuf + sizeof(mz_uint32) * 1, src_crc32);
                mz_write_le64((mz_uint8 *)pBuf + sizeof(mz_uint32) * 2, src_comp_size);
                mz_write_le64((mz_uint8 *)pBuf + sizeof(mz_uint32) * 4, src_uncomp_size);

                n = sizeof(mz_uint32) * 6;
            }
            else
            {
                /* dest is NOT zip64, just copy it as-is */
                n = sizeof(mz_uint32) * (has_id ? 4 : 3);
            }
        }

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_dst_file_ofs, pBuf, n) != n)
        {
            pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
        }

        cur_src_file_ofs += n;
        cur_dst_file_ofs += n;
    }
    pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);

    /* Finally, add the new central dir header */
    orig_central_dir_size = pState->m_central_dir.m_size;

    memcpy(new_central_header, pSrc_central_header, MZ_ZIP_CENTRAL_DIR_HEADER_SIZE);

    if (pState->m_zip64)
    {
        /* This is the painful part: We need to write a new central dir header + ext block with updated zip64 fields, and ensure the old fields (if any) are not included. */
        const mz_uint8 *pSrc_ext = pSrc_central_header + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + src_filename_len;
        mz_zip_array new_ext_block;

        mz_zip_array_init(&new_ext_block, sizeof(mz_uint8));

        MZ_WRITE_LE32(new_central_header + MZ_ZIP_CDH_COMPRESSED_SIZE_OFS, MZ_UINT32_MAX);
        MZ_WRITE_LE32(new_central_header + MZ_ZIP_CDH_DECOMPRESSED_SIZE_OFS, MZ_UINT32_MAX);
        MZ_WRITE_LE32(new_central_header + MZ_ZIP_CDH_LOCAL_HEADER_OFS, MZ_UINT32_MAX);

        if (!mz_zip_writer_update_zip64_extension_block(&new_ext_block, pZip, pSrc_ext, src_ext_len, &src_file_stat.m_comp_size, &src_file_stat.m_uncomp_size, &local_dir_header_ofs, NULL))
        {
            mz_zip_array_clear(pZip, &new_ext_block);
            return MZ_FALSE;
        }

        MZ_WRITE_LE16(new_central_header + MZ_ZIP_CDH_EXTRA_LEN_OFS, new_ext_block.m_size);

        if (!mz_zip_array_push_back(pZip, &pState->m_central_dir, new_central_header, MZ_ZIP_CENTRAL_DIR_HEADER_SIZE))
        {
            mz_zip_array_clear(pZip, &new_ext_block);
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }

        if (!mz_zip_array_push_back(pZip, &pState->m_central_dir, pSrc_central_header + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE, src_filename_len))
        {
            mz_zip_array_clear(pZip, &new_ext_block);
            mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }

        if (!mz_zip_array_push_back(pZip, &pState->m_central_dir, new_ext_block.m_p, new_ext_block.m_size))
        {
            mz_zip_array_clear(pZip, &new_ext_block);
            mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }

        if (!mz_zip_array_push_back(pZip, &pState->m_central_dir, pSrc_central_header + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + src_filename_len + src_ext_len, src_comment_len))
        {
            mz_zip_array_clear(pZip, &new_ext_block);
            mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }

        mz_zip_array_clear(pZip, &new_ext_block);
    }
    else
    {
        /* sanity checks */
        if (cur_dst_file_ofs > MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);

        if (local_dir_header_ofs >= MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);

        MZ_WRITE_LE32(new_central_header + MZ_ZIP_CDH_LOCAL_HEADER_OFS, local_dir_header_ofs);

        if (!mz_zip_array_push_back(pZip, &pState->m_central_dir, new_central_header, MZ_ZIP_CENTRAL_DIR_HEADER_SIZE))
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);

        if (!mz_zip_array_push_back(pZip, &pState->m_central_dir, pSrc_central_header + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE, src_central_dir_following_data_size))
        {
            mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }
    }

    /* This shouldn't trigger unless we screwed up during the initial sanity checks */
    if (pState->m_central_dir.m_size >= MZ_UINT32_MAX)
    {
        /* TODO: Support central dirs >= 32-bits in size */
        mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_CDIR_SIZE);
    }

    n = (mz_uint32)orig_central_dir_size;
    if (!mz_zip_array_push_back(pZip, &pState->m_central_dir_offsets, &n, 1))
    {
        mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
        return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
    }

    pZip->m_total_files++;
    pZip->m_archive_size = cur_dst_file_ofs;

    return MZ_TRUE;
}